

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedProcedure.cpp
# Opt level: O1

void __thiscall
slang::analysis::AnalyzedProcedure::AnalyzedProcedure
          (AnalyzedProcedure *this,AnalysisContext *context,Symbol *analyzedSymbol,
          AnalyzedProcedure *parentProcedure)

{
  vector<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  *this_00;
  TimingControl **__args_1;
  SymbolKind SVar1;
  StatementSyntax *pSVar2;
  ValueSymbol *pVVar3;
  unsigned_long left;
  ulong right;
  ulong uVar4;
  ProceduralBlockSymbol *__args_3;
  CallExpression **ppCVar5;
  bool bVar6;
  Statement *pSVar7;
  TimingControl *pTVar8;
  ClockingBlockSymbol *this_01;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *pvVar9;
  variant_alternative_t<1UL,_variant<const_Statement_*,_const_Expression_*>_> *ppEVar10;
  Type *this_02;
  Diagnostic *this_03;
  uint uVar11;
  DiagCode code;
  SymbolLSPMap *this_04;
  SubroutineSymbol *subroutine;
  long lVar12;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *var;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *__v;
  long lVar13;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_05;
  ulong uVar14;
  bool bVar15;
  Symbol *inst;
  const_iterator lit;
  DataFlowAnalysis dfa;
  overlap_iterator local_d70;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *local_d20;
  ProceduralBlockSymbol *local_d18;
  const_iterator local_d10;
  anon_class_24_3_ec3538fa local_cd0;
  const_iterator local_cb8;
  undefined1 local_c78 [2224];
  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  local_3c8;
  LValueSymbol *local_398;
  ulong local_390;
  LValueSymbol local_380 [4];
  IntervalMap<unsigned_long,_std::monostate,_3U> *local_140;
  long local_130;
  pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
  *local_120;
  Statement **local_f0;
  Statement *local_d8 [5];
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *local_b0;
  size_type local_a8;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> local_98 [2];
  CallExpression **local_78;
  size_type local_70;
  CallExpression *local_60 [6];
  
  (this->analyzedSymbol).ptr = analyzedSymbol;
  this->parentProcedure = parentProcedure;
  this_00 = &this->assertions;
  this->inferredClock = (TimingControl *)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DataFlowAnalysis::DataFlowAnalysis((DataFlowAnalysis *)local_c78,context,analyzedSymbol,true);
  if (analyzedSymbol->kind == ProceduralBlock) {
    pSVar7 = ast::ProceduralBlockSymbol::getBody((ProceduralBlockSymbol *)analyzedSymbol);
  }
  else {
    pSVar7 = ast::SubroutineSymbol::getBody((SubroutineSymbol *)analyzedSymbol);
  }
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
            ((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              *)local_c78,pSVar7);
  if (local_c78[0x14] == false) {
    if (((parentProcedure != (AnalyzedProcedure *)0x0) || (local_a8 != 0)) || (local_70 != 0)) {
      __args_1 = &this->inferredClock;
      if ((analyzedSymbol->kind == ProceduralBlock) && (analyzedSymbol[1].kind != Root)) {
        pTVar8 = DataFlowAnalysis::inferClock((DataFlowAnalysis *)local_c78,parentProcedure);
        *__args_1 = pTVar8;
      }
      if ((*__args_1 == (TimingControl *)0x0) &&
         (this_01 = (ClockingBlockSymbol *)
                    ast::Compilation::getDefaultClocking
                              (analyzedSymbol->parentScope->compilation,analyzedSymbol->parentScope)
         , this_01 != (ClockingBlockSymbol *)0x0)) {
        pTVar8 = ast::ClockingBlockSymbol::getEvent(this_01);
        *__args_1 = pTVar8;
      }
      if ((*__args_1 != (TimingControl *)0x0) && ((*__args_1)->kind == Invalid)) goto LAB_0037a422;
      if (local_a8 != 0) {
        local_d20 = local_b0 + local_a8;
        __v = local_b0;
        local_d18 = (ProceduralBlockSymbol *)analyzedSymbol;
        do {
          __args_3 = local_d18;
          if (__v == (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)0x0)
          {
            pvVar9 = (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)0x0;
          }
          else {
            pvVar9 = (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)0x0;
            if ((__v->
                super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
                super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                .
                super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                ._M_index == '\0') {
              pvVar9 = __v;
            }
          }
          if (pvVar9 == (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)
                        0x0) {
            ppEVar10 = std::get<1ul,slang::ast::Statement_const*,slang::ast::Expression_const*>(__v)
            ;
            local_d70.super_iterator.super_const_iterator.map =
                 (IntervalMap<unsigned_long,_std::monostate,_3U> *)this;
            std::
            vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
            ::
            emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure*,slang::ast::Symbol_const&,slang::ast::Expression_const&>
                      ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                        *)this_00,context,__args_1,(AnalyzedProcedure **)&local_d70,
                       &__args_3->super_Symbol,*ppEVar10);
          }
          else {
            pSVar7 = *(Statement **)
                      &(pvVar9->
                       super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                       ).
                       super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                       .
                       super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                       .
                       super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                       .
                       super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                       .
                       super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                       ._M_u;
            if (pSVar7->kind == ProceduralChecker) {
              pSVar2 = pSVar7[1].syntax;
              if (pSVar2 != (StatementSyntax *)0x0) {
                lVar13 = *(long *)(pSVar7 + 1);
                lVar12 = 0;
                do {
                  local_d70.super_iterator.super_const_iterator.map =
                       *(IntervalMap<unsigned_long,_std::monostate,_3U> **)(lVar13 + lVar12);
                  std::
                  vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                  ::
                  emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,slang::ast::Symbol_const*&>
                            ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                              *)this_00,context,__args_1,this,pSVar7,(Symbol **)&local_d70);
                  lVar12 = lVar12 + 8;
                } while ((long)pSVar2 << 3 != lVar12);
              }
            }
            else {
              local_d70.super_iterator.super_const_iterator.map =
                   (IntervalMap<unsigned_long,_std::monostate,_3U> *)0x0;
              std::
              vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
              ::
              emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,decltype(nullptr)>
                        ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                          *)this_00,context,__args_1,this,pSVar7,(void **)&local_d70);
            }
          }
          __v = __v + 1;
          analyzedSymbol = &local_d18->super_Symbol;
        } while (__v != local_d20);
      }
      ppCVar5 = local_78;
      if ((*__args_1 == (TimingControl *)0x0) && (local_70 != 0)) {
        lVar13 = 0;
        do {
          ClockInference::checkSampledValueFuncs
                    (context,analyzedSymbol,*(Expression **)((long)ppCVar5 + lVar13));
          lVar13 = lVar13 + 8;
        } while (local_70 << 3 != lVar13);
      }
    }
    SVar1 = (((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).kind;
    if (SVar1 == Subroutine) {
      if ((local_c78[0x408] == true) &&
         (*(int *)((long)&(((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->blocks)._M_ptr
                  + 4) == 0)) {
        this_02 = ast::DeclaredType::getType
                            ((DeclaredType *)
                             &(((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->
                              super_Symbol).name);
        if (this_02->canonical == (Type *)0x0) {
          ast::Type::resolveCanonical(this_02);
        }
        if ((((this_02->canonical->super_Symbol).kind != VoidType) &&
            ((((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).name._M_len != 0)) &&
           (bVar6 = DataFlowAnalysis::isDefinitelyAssigned
                              ((DataFlowAnalysis *)local_c78,
                               (ValueSymbol *)
                               ((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->stmt),
           !bVar6)) {
          code.subsystem = Analysis;
          code.code = 0x15;
          if (local_c78._1720_8_ == 0) {
            bVar6 = DataFlowAnalysis::isReferenced
                              ((DataFlowAnalysis *)local_c78,
                               (ValueSymbol *)
                               ((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->stmt);
            code = (DiagCode)((uint)!bVar6 << 0x11 | 0x15000e);
          }
          this_03 = AnalysisContext::addDiag
                              (context,analyzedSymbol,code,
                               (((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).location);
          Diagnostic::operator<<
                    (this_03,(((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).name);
        }
      }
    }
    else if (((SVar1 == ProceduralBlock) &&
             (((ProceduralBlockSymbol *)analyzedSymbol)->procedureKind == AlwaysComb)) &&
            (local_cd0.dfa = (DataFlowAnalysis *)local_c78, local_cd0.context = context,
            local_cd0.procedure = (ProceduralBlockSymbol *)analyzedSymbol, local_390 != 0)) {
      uVar14 = 0;
      do {
        pVVar3 = local_398[uVar14].symbol.ptr;
        uVar11 = (pVVar3->super_Symbol).kind - Variable;
        if (((0x18 < uVar11) || ((0x1800c0fU >> (uVar11 & 0x1f) & 1) == 0)) ||
           (pVVar3[1].super_Symbol.kind != Unknown)) {
          this_04 = &local_398[uVar14].assigned;
          if (uVar14 < (ulong)local_c78._888_8_) {
            this_05 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                      (local_c78._880_8_ + uVar14 * 0x40);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin
                      (&local_d10,this_04);
            while( true ) {
              IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                        ((const_iterator *)&local_d70,this_04);
              bVar6 = IntervalMapDetails::Path::operator==
                                (&local_d10.path,&local_d70.super_iterator.super_const_iterator.path
                                );
              if (local_d70.super_iterator.super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                  (pointer)((long)&local_d70.super_iterator.super_const_iterator.path.path.
                                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                           0x18U)) {
                operator_delete(local_d70.super_iterator.super_const_iterator.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)
                ;
              }
              if (bVar6) break;
              lVar13 = (ulong)local_d10.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [local_d10.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1
                              ].offset * 0x10;
              left = *(unsigned_long *)
                      ((long)local_d10.path.path.
                             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                             [local_d10.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1]
                             .node + lVar13);
              right = *(ulong *)((long)local_d10.path.path.
                                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                       .data_[local_d10.path.path.
                                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                              .len - 1].node + lVar13 + 8);
              IntervalMap<unsigned_long,_std::monostate,_3U>::find(&local_d70,this_05,left,right);
              IntervalMap<unsigned_long,_std::monostate,_3U>::end(&local_cb8,this_05);
              bVar6 = IntervalMapDetails::Path::operator==
                                (&local_d70.super_iterator.super_const_iterator.path,&local_cb8.path
                                );
              if (local_cb8.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                  data_ != (pointer)local_cb8.path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    firstElement) {
                operator_delete(local_cb8.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)
                ;
              }
              if ((bVar6) ||
                 (lVar13 = (ulong)local_d70.super_iterator.super_const_iterator.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  data_[local_d70.super_iterator.super_const_iterator.path.path.
                                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                        .len - 1].offset * 0x10,
                 uVar4 = *(ulong *)((long)local_d70.super_iterator.super_const_iterator.path.path.
                                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                          .data_[local_d70.super_iterator.super_const_iterator.path.
                                                 path.
                                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                                 .len - 1].node + lVar13),
                 bVar15 = *(ulong *)((long)local_d70.super_iterator.super_const_iterator.path.path.
                                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                           .data_[local_d70.super_iterator.super_const_iterator.path
                                                  .path.
                                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                                  .len - 1].node + lVar13 + 8) < right,
                 bVar6 = bVar15 || left < uVar4, bVar15 || left < uVar4)) {
                bVar6 = true;
              }
              if (local_d70.super_iterator.super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                  (pointer)((long)&local_d70.super_iterator.super_const_iterator.path.path.
                                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                           0x18U)) {
                operator_delete(local_d70.super_iterator.super_const_iterator.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)
                ;
              }
              if (bVar6) {
                lVar13 = 0x50;
                if ((local_d10.map)->height != 0) {
                  lVar13 = 0x80;
                }
                AnalyzedProcedure::anon_class_24_3_ec3538fa::operator()
                          (&local_cd0,
                           *(Symbol **)
                            ((long)(local_d10.path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    data_ + -1)
                                   [local_d10.path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    len].node +
                            (ulong)(local_d10.path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    data_ + -1)
                                   [local_d10.path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    len].offset * 8 + lVar13),
                           (Expression *)
                           (local_d10.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len * 0x10
                           ));
              }
              IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
              operator++(&local_d10);
            }
            if (local_d10.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                data_ != (pointer)local_d10.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  firstElement) {
              operator_delete(local_d10.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
          }
          else {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin
                      ((const_iterator *)&local_d70,this_04);
            while( true ) {
              IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                        (&local_d10,this_04);
              bVar6 = IntervalMapDetails::Path::operator==
                                (&local_d70.super_iterator.super_const_iterator.path,&local_d10.path
                                );
              if (local_d10.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                  data_ != (pointer)local_d10.path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    firstElement) {
                operator_delete(local_d10.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)
                ;
              }
              if (bVar6) break;
              lVar13 = 0x50;
              if (local_d70.super_iterator.super_const_iterator.map[1].height != 0) {
                lVar13 = 0x80;
              }
              AnalyzedProcedure::anon_class_24_3_ec3538fa::operator()
                        (&local_cd0,
                         *(Symbol **)
                          ((long)local_d70.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                                 [local_d70.super_iterator.super_const_iterator.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len
                                  - 1].node +
                          (long)(ulong)local_d70.super_iterator.super_const_iterator.path.path.
                                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                       .data_[local_d70.super_iterator.super_const_iterator.path.
                                              path.
                                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                              .len - 1].offset * 8 + lVar13),
                         (Expression *)
                         (ulong)local_d70.super_iterator.super_const_iterator.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                                [local_d70.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len -
                                 1].offset);
              IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
              operator++((const_iterator *)&local_d70);
            }
            if (local_d70.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)((long)&local_d70.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                         0x18U)) {
              operator_delete(local_d70.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < local_390);
    }
  }
LAB_0037a422:
  if (local_78 != local_60) {
    operator_delete(local_78);
  }
  if (local_b0 != local_98) {
    operator_delete(local_b0);
  }
  if (local_f0 != local_d8) {
    operator_delete(local_f0);
  }
  local_d70.super_iterator.super_const_iterator.map = local_140;
  if (local_120 !=
      (pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
       *)0x0) {
    detail::hashing::
    StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>
    ::deallocate((StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>
                  *)&local_d70,local_120,(local_130 * 0x448 + 0x456U) / 0x48);
  }
  if (local_398 != local_380) {
    operator_delete(local_398);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  ::delete_((allocator_type)local_c78._2216_8_,&local_3c8);
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
  ~AbstractFlowAnalysis
            ((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              *)local_c78);
  return;
}

Assistant:

AnalyzedProcedure::AnalyzedProcedure(AnalysisContext& context, const Symbol& analyzedSymbol,
                                     const AnalyzedProcedure* parentProcedure) :
    analyzedSymbol(&analyzedSymbol), parentProcedure(parentProcedure) {

    DataFlowAnalysis dfa(context, analyzedSymbol, true);
    switch (analyzedSymbol.kind) {
        case SymbolKind::ProceduralBlock:
            dfa.run(analyzedSymbol.as<ProceduralBlockSymbol>().getBody());
            break;
        case SymbolKind::Subroutine:
            dfa.run(analyzedSymbol.as<SubroutineSymbol>().getBody());
            break;
        default:
            SLANG_UNREACHABLE;
    }

    if (dfa.bad)
        return;

    if (parentProcedure || !dfa.getAssertions().empty() || !dfa.getSampledValueCalls().empty()) {
        // All flavors of always and initial blocks can infer a clock.
        if (analyzedSymbol.kind == SymbolKind::ProceduralBlock &&
            analyzedSymbol.as<ProceduralBlockSymbol>().procedureKind !=
                ProceduralBlockKind::Final) {
            inferredClock = dfa.inferClock(parentProcedure);
        }

        // If no procedural inferred clock, check the scope for a default clocking block.
        if (!inferredClock) {
            auto scope = analyzedSymbol.getParentScope();
            SLANG_ASSERT(scope);

            if (auto defaultClocking = scope->getCompilation().getDefaultClocking(*scope))
                inferredClock = &defaultClocking->as<ClockingBlockSymbol>().getEvent();
        }

        if (inferredClock && inferredClock->bad())
            return;

        for (auto& var : dfa.getAssertions()) {
            if (auto stmtPtr = std::get_if<const Statement*>(&var)) {
                auto& stmt = **stmtPtr;
                if (stmt.kind == StatementKind::ProceduralChecker) {
                    for (auto inst : stmt.as<ProceduralCheckerStatement>().instances)
                        assertions.emplace_back(context, inferredClock, *this, stmt, inst);
                }
                else {
                    assertions.emplace_back(context, inferredClock, *this, stmt, nullptr);
                }
            }
            else {
                auto& expr = *std::get<const Expression*>(var);
                assertions.emplace_back(context, inferredClock, this, analyzedSymbol, expr);
            }
        }

        // If we have no inferred clock then all sampled value system calls must provide
        // a clocking argument explicitly.
        if (!inferredClock) {
            for (auto call : dfa.getSampledValueCalls())
                ClockInference::checkSampledValueFuncs(context, analyzedSymbol, *call);
        }
    }

    if (analyzedSymbol.kind == SymbolKind::ProceduralBlock) {
        auto& procedure = analyzedSymbol.as<ProceduralBlockSymbol>();
        if (procedure.procedureKind == ProceduralBlockKind::AlwaysComb) {
            dfa.visitLatches([&](const Symbol&, const Expression& expr) {
                FormatBuffer buffer;
                stringifyLSP(expr, dfa.getEvalContext(), buffer);

                context.addDiag(procedure, diag::InferredLatch, expr.sourceRange) << buffer.str();
            });
        }
    }
    else if (analyzedSymbol.kind == SymbolKind::Subroutine) {
        // Diagnose missing return statements and/or incomplete
        // assignments to the return value var.
        auto& subroutine = analyzedSymbol.as<SubroutineSymbol>();
        if (dfa.isReachable() && subroutine.subroutineKind == SubroutineKind::Function &&
            !subroutine.getReturnType().isVoid() && !subroutine.name.empty()) {

            // Control falls off the end of a non-void function but that is
            // fine if the return value var is definitely assigned here.
            SLANG_ASSERT(subroutine.returnValVar);
            if (!dfa.isDefinitelyAssigned(*subroutine.returnValVar)) {
                if (dfa.hasReturnStatements() || dfa.isReferenced(*subroutine.returnValVar)) {
                    context.addDiag(subroutine, diag::IncompleteReturn, subroutine.location)
                        << subroutine.name;
                }
                else {
                    context.addDiag(subroutine, diag::MissingReturn, subroutine.location)
                        << subroutine.name;
                }
            }
        }
    }
}